

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  nullres nVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  FILE *pFVar11;
  ulong uVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  char **ppcVar16;
  uint *puVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  char *pos;
  char tmp [256];
  char cmdLine [4096];
  uint *local_1468;
  char **local_1460;
  ulong local_1458;
  char *local_1450;
  FILE *local_1448;
  int local_143c;
  char local_1438 [1024];
  undefined1 local_1038 [4];
  char acStack_1034 [9];
  char acStack_102b [4091];
  
  nullcInit();
  nullcAddImportPath("Modules/");
  if (argc == 1) {
    puts("usage: nullcl [-o output.ncm] file.nc [-m module.name] [file2.nc [-m module.name] ...]");
    puts("usage: nullcl -c [-i import_folder] output.cpp file.nc");
    puts("usage: nullcl -x [-i import_folder] output.exe file.nc");
    return 1;
  }
  iVar7 = strcmp("-v",argv[1]);
  uVar9 = (uint)(iVar7 == 0);
  uVar19 = uVar9 + 1;
  uVar12 = (ulong)uVar19;
  pcVar18 = argv[uVar12];
  iVar8 = strcmp("-o",pcVar18);
  local_1450 = (char *)CONCAT44(local_1450._4_4_,argc);
  if (iVar8 == 0) {
    uVar19 = uVar9 + 2;
    if (uVar19 != argc) {
      local_1448 = fopen(argv[uVar19],"wb");
      if (local_1448 != (FILE *)0x0) {
        uVar12 = (ulong)(uVar9 + 3);
        goto LAB_00109c58;
      }
      pcVar18 = argv[uVar19];
      pcVar13 = "Cannot create output file %s\n";
LAB_0010a451:
      printf(pcVar13,pcVar18);
      goto LAB_0010a408;
    }
    pcVar18 = "Output file name not found after -o";
  }
  else {
    iVar8 = strcmp("-c",pcVar18);
    if ((iVar8 != 0) && (iVar8 = strcmp("-x",pcVar18), iVar8 != 0)) {
      local_1448 = (FILE *)0x0;
LAB_00109c58:
      local_143c = 0;
      uVar20 = uVar12;
      local_1460 = argv;
      local_1458 = uVar12;
      do {
        uVar19 = (uint)uVar20;
        uVar9 = (uint)uVar12;
        if (argc <= (int)uVar9) goto LAB_0010a08a;
        uVar19 = uVar9 + 1;
        pcVar18 = argv[(int)uVar9];
        pFVar11 = fopen(pcVar18,"rb");
        if (pFVar11 == (FILE *)0x0) {
          printf("Cannot open file %s\n",pcVar18);
          argv = local_1460;
          uVar20 = local_1458;
          iVar7 = 8;
          uVar9 = uVar19;
        }
        else {
          fseek(pFVar11,0,2);
          uVar12 = ftell(pFVar11);
          fseek(pFVar11,0,0);
          pcVar13 = (char *)operator_new__((ulong)((int)uVar12 + 1));
          fread(pcVar13,1,uVar12 & 0xffffffff,pFVar11);
          pcVar13[uVar12 & 0xffffffff] = '\0';
          fclose(pFVar11);
          nVar5 = nullcCompile(pcVar13);
          if (nVar5 == '\0') {
            pcVar15 = nullcGetLastError();
            printf("Compilation of %s failed with error:\n%s\n",pcVar18,pcVar15);
            operator_delete__(pcVar13);
            nullcTerminate();
            local_143c = 1;
            argv = local_1460;
            uVar20 = local_1458;
            argc = (uint)local_1450;
            iVar7 = 1;
            uVar9 = uVar19;
          }
          else {
            local_1468 = (uint *)0x0;
            nullcGetBytecode((char **)&local_1468);
            operator_delete__(pcVar13);
            argc = (uint)local_1450;
            if (((int)uVar19 < (int)(uint)local_1450) &&
               (iVar7 = strcmp("-m",local_1460[(int)uVar19]), iVar7 == 0)) {
              uVar19 = uVar9 + 2;
              if (uVar19 == argc) {
                puts("Module name not found after -m");
              }
              else {
                pcVar13 = local_1460[(int)uVar19];
                sVar14 = strlen(pcVar13);
                if (0xfffffffffffffbff < sVar14 - 0x3ff) {
                  strcpy(local_1038,pcVar13);
                  uVar19 = uVar9 + 3;
                  uVar20 = local_1458;
                  goto LAB_00109e53;
                }
                puts("Module name is too long");
              }
              iVar8 = 8;
              iVar7 = 8;
              argv = local_1460;
              uVar20 = local_1458;
            }
            else {
              sVar14 = strlen(pcVar18);
              uVar20 = local_1458;
              if (sVar14 - 0x3ff < 0xfffffffffffffc00) {
                puts("File name is too long");
                iVar8 = 8;
                iVar7 = 8;
                argv = local_1460;
              }
              else {
                pcVar13 = local_1038;
                strcpy(pcVar13,pcVar18);
                pcVar15 = strchr(pcVar13,0x2e);
                cVar4 = local_1038[0];
                if (pcVar15 != (char *)0x0) {
                  *pcVar15 = '\0';
                }
                while (cVar4 != '\0') {
                  if (cVar4 == '\\') {
                    pcVar15 = pcVar13 + 1;
LAB_00109e46:
                    pcVar15[-1] = '.';
                  }
                  else {
                    pcVar15 = pcVar13 + 2;
                    if (pcVar13[1] == '/') goto LAB_00109e46;
                  }
                  pcVar13 = pcVar15;
                  cVar4 = *pcVar15;
                }
LAB_00109e53:
                pFVar11 = local_1448;
                nullcLoadModuleByBinary(local_1038,(char *)local_1468);
                if (pFVar11 == (FILE *)0x0) {
                  sVar14 = strlen(pcVar18);
                  if (sVar14 - 0x3fe < 0xfffffffffffffc01) {
                    puts("File name is too long");
                    iVar7 = 8;
                    if (local_1468 != (uint *)0x0) {
                      operator_delete__(local_1468);
                    }
                    bVar6 = false;
                    argv = local_1460;
                  }
                  else {
                    strcpy(local_1438,pcVar18);
                    sVar14 = strlen(local_1438);
                    (local_1438 + sVar14)[0] = 'm';
                    (local_1438 + sVar14)[1] = '\0';
                    pFVar11 = fopen(local_1438,"wb");
                    if (pFVar11 == (FILE *)0x0) {
                      bVar6 = false;
                      printf("Cannot create output file %s\n",local_1438);
                      argv = local_1460;
                      iVar7 = 8;
                      uVar20 = local_1458;
                      if (local_1468 != (uint *)0x0) {
                        operator_delete__(local_1468);
                        bVar6 = false;
                        uVar20 = local_1458;
                      }
                    }
                    else {
                      sVar14 = strlen(local_1038);
                      fwrite(local_1038,1,sVar14 + 1,pFVar11);
                      fwrite(local_1468,1,(ulong)*local_1468,pFVar11);
                      fclose(pFVar11);
                      iVar7 = 0;
                      bVar6 = true;
                      argv = local_1460;
                      uVar20 = local_1458;
                    }
                  }
                  uVar9 = uVar19;
                  if (!bVar6) goto LAB_0010a055;
                }
                else {
                  sVar14 = strlen(local_1038);
                  fwrite(local_1038,1,sVar14 + 1,pFVar11);
                  fwrite(local_1468,1,(ulong)*local_1468,pFVar11);
                  argv = local_1460;
                }
                iVar8 = 0;
                iVar7 = 0;
              }
            }
            uVar9 = uVar19;
            if (local_1468 != (uint *)0x0) {
              operator_delete__(local_1468);
              iVar7 = iVar8;
            }
          }
        }
LAB_0010a055:
        uVar12 = (ulong)uVar9;
        uVar19 = (uint)uVar20;
      } while (iVar7 == 0);
      if (iVar7 != 8) {
        return local_143c;
      }
LAB_0010a08a:
      pFVar11 = local_1448;
      if (uVar19 == uVar9) {
        puts("None of the input files were found");
      }
      if (pFVar11 != (FILE *)0x0) {
        fclose(pFVar11);
      }
      nullcTerminate();
      return (uint)(uVar9 != argc);
    }
    iVar8 = strcmp("-x",pcVar18);
    uVar9 = uVar9 + 2;
    if ((int)uVar9 < argc) {
      do {
        iVar2 = (int)uVar12;
        iVar10 = strcmp("-i",argv[iVar2 + 1]);
        if (iVar10 != 0) break;
        if ((ulong)(uint)argc - 2 == uVar12) {
          pcVar18 = "Missing folder name after -i";
          goto LAB_0010a403;
        }
        lVar3 = uVar12 + 2;
        uVar12 = uVar12 + 2;
        nullcAddImportPath(argv[lVar3]);
      } while (iVar2 + 3 < (int)(uint)local_1450);
      uVar19 = (uint)uVar12;
      uVar9 = uVar19 + 1;
      argc = (uint)local_1450;
    }
    if (uVar9 == argc) {
      pcVar18 = "Output file name not found after options";
    }
    else {
      if (uVar19 + 2 != argc) {
        pcVar13 = argv[uVar9];
        pcVar18 = argv[uVar19 + 2];
        pFVar11 = fopen(pcVar18,"rb");
        if (pFVar11 != (FILE *)0x0) {
          local_1450 = pcVar13;
          fseek(pFVar11,0,2);
          uVar12 = ftell(pFVar11);
          fseek(pFVar11,0,0);
          ppcVar16 = (char **)operator_new__((ulong)((int)uVar12 + 1));
          fread(ppcVar16,1,uVar12 & 0xffffffff,pFVar11);
          *(char *)((long)ppcVar16 + (uVar12 & 0xffffffff)) = '\0';
          fclose(pFVar11);
          nVar5 = nullcCompile((char *)ppcVar16);
          pcVar13 = local_1450;
          if (nVar5 != '\0') {
            pcVar15 = "__temp.cpp";
            if (iVar8 != 0) {
              pcVar15 = local_1450;
            }
            nVar5 = nullcTranslateToC(pcVar15,"main",AddDependency);
            if (nVar5 != '\0') {
              if (iVar8 == 0) {
                local_1468 = (uint *)local_1038;
                local_1038[0] = 'g';
                stack0xffffffffffffefc9 = 0x20672d206363;
                builtin_strncpy(acStack_1034 + 3,"-o ",4);
                local_1460 = ppcVar16;
                sVar14 = strlen((char *)local_1468);
                puVar17 = (uint *)(local_1038 + sVar14);
                local_1468 = puVar17;
                strcpy((char *)puVar17,pcVar13);
                sVar14 = strlen((char *)puVar17);
                puVar1 = (uint *)((long)puVar17 + sVar14);
                builtin_strncpy((char *)((long)puVar17 + sVar14)," __temp.",8);
                builtin_strncpy((char *)((long)puVar17 + sVar14 + 8),"cpp",4);
                local_1468 = puVar1;
                sVar14 = strlen((char *)puVar1);
                puVar17 = (uint *)((long)puVar1 + sVar14);
                builtin_strncpy((char *)((long)puVar1 + sVar14)," -Itrans",8);
                builtin_strncpy((char *)((long)puVar1 + sVar14 + 7),"slation",8);
                local_1468 = puVar17;
                sVar14 = strlen((char *)puVar17);
                puVar1 = (uint *)((long)puVar17 + sVar14);
                builtin_strncpy((char *)((long)puVar17 + sVar14)," -INULLC/transla",0x10);
                builtin_strncpy((char *)((long)puVar17 + sVar14 + 0xd),"slation",8);
                local_1468 = puVar1;
                sVar14 = strlen((char *)puVar1);
                puVar17 = (uint *)((long)puVar1 + sVar14);
                builtin_strncpy((char *)((long)puVar1 + sVar14)," -I../NULLC/tran",0x10);
                builtin_strncpy((char *)((long)puVar1 + sVar14 + 0x10),"slation",8);
                local_1468 = puVar17;
                sVar14 = strlen((char *)puVar17);
                puVar1 = (uint *)((long)puVar17 + sVar14);
                builtin_strncpy((char *)((long)puVar17 + sVar14)," -O2",4);
                *(char *)((long)puVar17 + sVar14 + 4) = '\0';
                local_1468 = puVar1;
                sVar14 = strlen((char *)puVar1);
                local_1468 = (uint *)((long)puVar1 + sVar14);
                bVar6 = SearchAndAddSourceFile((char **)&local_1468,"runtime.cpp");
                if (!bVar6) {
                  puts("Failed to find \'runtime.cpp\' input file");
                }
                if (translationDependencyCount != 0) {
                  ppcVar16 = translationDependencies;
                  uVar12 = 0;
                  do {
                    puVar17 = local_1468;
                    pcVar18 = *ppcVar16;
                    puVar1 = (uint *)((long)local_1468 + 1);
                    *(char *)local_1468 = ' ';
                    local_1468 = puVar1;
                    strcpy((char *)puVar1,pcVar18);
                    sVar14 = strlen((char *)puVar1);
                    local_1468 = (uint *)((long)puVar17 + sVar14 + 1);
                    pcVar13 = strstr(pcVar18,"import_");
                    if (pcVar13 != (char *)0x0) {
                      format(local_1438,0x100,"%s",pcVar18 + 7);
                      pcVar18 = strstr(local_1438,"_nc.cpp");
                      if (pcVar18 != (char *)0x0) {
                        builtin_strncpy(pcVar18,"_bind.cpp",10);
                      }
                      bVar6 = SearchAndAddSourceFile((char **)&local_1468,local_1438);
                      if (!bVar6) {
                        printf("Failed to find \'%s\' input file\n",local_1438);
                      }
                    }
                    uVar12 = uVar12 + 1;
                    ppcVar16 = ppcVar16 + 1;
                  } while (uVar12 < translationDependencyCount);
                }
                puVar1 = local_1468;
                builtin_strncpy((char *)((long)local_1468 + 6),"c++ -lm",8);
                local_1468[0] = 0x736c2d20;
                local_1468[1] = 0x2b636474;
                sVar14 = strlen((char *)local_1468);
                local_1468 = (uint *)((long)puVar1 + sVar14);
                if (iVar7 == 0) {
                  printf("Command line: %s\n",local_1038);
                }
                system(local_1038);
                ppcVar16 = local_1460;
              }
              operator_delete__(ppcVar16);
              nullcTerminate();
              return 0;
            }
          }
          pcVar13 = nullcGetLastError();
          printf("Compilation of %s failed with error:\n%s\n",pcVar18,pcVar13);
          operator_delete__(ppcVar16);
          return 1;
        }
        pcVar13 = "Cannot open file %s\n";
        goto LAB_0010a451;
      }
      pcVar18 = "Input file name not found after output file name";
    }
  }
LAB_0010a403:
  puts(pcVar18);
LAB_0010a408:
  nullcTerminate();
  return 1;
}

Assistant:

int main(int argc, char** argv)
{
	nullcInit();
	nullcAddImportPath("Modules/");

	if(argc == 1)
	{
		printf("usage: nullcl [-o output.ncm] file.nc [-m module.name] [file2.nc [-m module.name] ...]\n");
		printf("usage: nullcl -c [-i import_folder] output.cpp file.nc\n");
		printf("usage: nullcl -x [-i import_folder] output.exe file.nc\n");
		return 1;
	}

	int argIndex = 1;
	FILE *mergeFile = NULL;
	bool verbose = false;

	if(strcmp("-v", argv[argIndex]) == 0)
	{
		argIndex++;

		verbose = true;
	}

	if(strcmp("-o", argv[argIndex]) == 0)
	{
		argIndex++;
		if(argIndex == argc)
		{
			printf("Output file name not found after -o\n");
			nullcTerminate();
			return 1;
		}
		mergeFile = fopen(argv[argIndex], "wb");
		if(!mergeFile)
		{
			printf("Cannot create output file %s\n", argv[argIndex]);
			nullcTerminate();
			return 1;
		}
		argIndex++;
	}else if(strcmp("-c", argv[argIndex]) == 0 || strcmp("-x", argv[argIndex]) == 0){
		bool link = strcmp("-x", argv[argIndex]) == 0;
		argIndex++;

		while(argIndex < argc && strcmp("-i", argv[argIndex]) == 0)
		{
			argIndex++;

			if(argIndex == argc)
			{
				printf("Missing folder name after -i\n");
				nullcTerminate();
				return 1;
			}

			const char* folder = argv[argIndex++];
			nullcAddImportPath(folder);
		}

		if(argIndex == argc)
		{
			printf("Output file name not found after options\n");
			nullcTerminate();
			return 1;
		}

		const char *outputName = argv[argIndex++];

		if(argIndex == argc)
		{
			printf("Input file name not found after output file name\n");
			nullcTerminate();
			return 1;
		}

		const char *fileName = argv[argIndex++];
		FILE *ncFile = fopen(fileName, "rb");
		if(!ncFile)
		{
			printf("Cannot open file %s\n", fileName);
			nullcTerminate();
			return 1;
		}

		fseek(ncFile, 0, SEEK_END);
		unsigned int textSize = ftell(ncFile);
		fseek(ncFile, 0, SEEK_SET);
		char *fileContent = new char[textSize+1];
		fread(fileContent, 1, textSize, ncFile);
		fileContent[textSize] = 0;
		fclose(ncFile);

		if(!nullcCompile(fileContent))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			return 1;
		}

		if(!nullcTranslateToC(link ? "__temp.cpp" : outputName, "main", AddDependency))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			return 1;
		}

		if(link)
		{
			// $$$ move this to a dependency file?
			char cmdLine[4096];

			char *pos = cmdLine;
			strcpy(pos, "gcc -g -o ");
			pos += strlen(pos);

			strcpy(pos, outputName);
			pos += strlen(pos);

			strcpy(pos, " __temp.cpp");
			pos += strlen(pos);

			strcpy(pos, " -Itranslation");
			pos += strlen(pos);

			strcpy(pos, " -INULLC/translation");
			pos += strlen(pos);

			strcpy(pos, " -I../NULLC/translation");
			pos += strlen(pos);

			strcpy(pos, " -O2");
			pos += strlen(pos);

			if(!SearchAndAddSourceFile(pos, "runtime.cpp"))
				printf("Failed to find 'runtime.cpp' input file\n");

			for(unsigned i = 0; i < translationDependencyCount; i++)
			{
				const char *dependency = translationDependencies[i];

				*(pos++) = ' ';

				strcpy(pos, dependency);
				pos += strlen(pos);

				if(strstr(dependency, "import_"))
				{
					char tmp[256];
					format(tmp, 256, "%s", dependency + strlen("import_"));

					if(char *pos = strstr(tmp, "_nc.cpp"))
						strcpy(pos, "_bind.cpp");

					if(!SearchAndAddSourceFile(pos, tmp))
						printf("Failed to find '%s' input file\n", tmp);
				}
			}

			strcpy(pos, " -lstdc++ -lm");
			pos += strlen(pos);

			if (verbose)
				printf("Command line: %s\n", cmdLine);

			system(cmdLine);
		}
		delete[] fileContent;
		nullcTerminate();
		return 0;
	}
	int currIndex = argIndex;
	while(argIndex < argc)
	{
		const char *fileName = argv[argIndex++];

		FILE *ncFile = fopen(fileName, "rb");
		if(!ncFile)
		{
			printf("Cannot open file %s\n", fileName);
			break;
		}

		fseek(ncFile, 0, SEEK_END);
		unsigned int textSize = ftell(ncFile);
		fseek(ncFile, 0, SEEK_SET);
		char *fileContent = new char[textSize+1];
		fread(fileContent, 1, textSize, ncFile);
		fileContent[textSize] = 0;
		fclose(ncFile);

		if(!nullcCompile(fileContent))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			nullcTerminate();
			return 1;
		}
		unsigned int *bytecode = NULL;
		nullcGetBytecode((char**)&bytecode);
		delete[] fileContent;

		// Create module name
		char	moduleName[1024];
		if(argIndex < argc && strcmp("-m", argv[argIndex]) == 0)
		{
			argIndex++;
			if(argIndex == argc)
			{
				printf("Module name not found after -m\n");

				delete[] bytecode;
				break;
			}

			if(strlen(argv[argIndex]) + 1 >= 1024)
			{
				printf("Module name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(moduleName, argv[argIndex]);

			argIndex++;
		}
		else
		{
			if(strlen(fileName) + 1 >= 1024)
			{
				printf("File name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(moduleName, fileName);
			if(char *extensionPos = strchr(moduleName, '.'))
				*extensionPos = '\0';
			char	*pos = moduleName;
			while(*pos)
			{
				if(*pos++ == '\\' || *pos++ == '/')
					pos[-1] = '.';
			}
		}
		nullcLoadModuleByBinary(moduleName, (const char*)bytecode);

		if(!mergeFile)
		{
			char newName[1024];

			// Ont extra character for 'm' appended at the end
			if(strlen(fileName) + 1 >= 1024 - 1)
			{
				printf("File name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(newName, fileName);
			strcat(newName, "m");
			FILE *nmcFile = fopen(newName, "wb");
			if(!nmcFile)
			{
				printf("Cannot create output file %s\n", newName);

				delete[] bytecode;
				break;
			}
			fwrite(moduleName, 1, strlen(moduleName) + 1, nmcFile);
			fwrite(bytecode, 1, *bytecode, nmcFile);
			fclose(nmcFile);
		}else{
			fwrite(moduleName, 1, strlen(moduleName) + 1, mergeFile);
			fwrite(bytecode, 1, *bytecode, mergeFile);
		}

		delete[] bytecode;
	}
	if(currIndex == argIndex)
		printf("None of the input files were found\n");

	if(mergeFile)
		fclose(mergeFile);

	nullcTerminate();

	return argIndex != argc;	
}